

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O3

void Aig_ObjDeletePo(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((*(uint *)&pObj->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x107,"void Aig_ObjDeletePo(Aig_Man_t *, Aig_Obj_t *)");
  }
  uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  uVar2 = *(ulong *)(uVar3 + 0x18);
  if ((uVar2 & 0xffffffc0) != 0) {
    *(ulong *)(uVar3 + 0x18) = uVar2 & 0xffffffff0000003f | (ulong)((int)uVar2 - 0x40U & 0xffffffc0)
    ;
    pObj->pFanin0 = (Aig_Obj_t *)0x0;
    p->nObjs[*(uint *)&pObj->field_0x18 & 7] = p->nObjs[*(uint *)&pObj->field_0x18 & 7] + -1;
    iVar1 = pObj->Id;
    if ((-1 < (long)iVar1) && (iVar1 < p->vObjs->nSize)) {
      p->vObjs->pArray[iVar1] = (void *)0x0;
      if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) == 0) {
        *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffff00000038;
        Aig_MmFixedEntryRecycle(p->pMemObjs,(char *)pObj);
        p->nDeleted = p->nDeleted + 1;
        return;
      }
      __assert_fail("pEntry->nRefs == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x17d,"void Aig_ManRecycleMemory(Aig_Man_t *, Aig_Obj_t *)");
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  __assert_fail("pObj->nRefs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x12e,"void Aig_ObjDeref(Aig_Obj_t *)");
}

Assistant:

void Aig_ObjDeletePo( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    assert( Aig_ObjIsCo(pObj) );
    Aig_ObjDeref(Aig_ObjFanin0(pObj));
    pObj->pFanin0 = NULL;
    p->nObjs[pObj->Type]--;
    Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
    Aig_ManRecycleMemory( p, pObj );
}